

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

bool __thiscall kj::anon_unknown_8::rmrf(anon_unknown_8 *this,int fd,StringPtr path)

{
  int iVar1;
  int fd_00;
  int iVar2;
  undefined4 in_register_00000034;
  char *pcVar3;
  Fault f;
  stat stats;
  Fault local_c0;
  StringPtr local_b8;
  stat local_a8;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,fd);
  local_b8.content.size_ = (size_t)path.content.ptr;
  local_b8.content.ptr = pcVar3;
  do {
    iVar2 = (int)this;
    iVar1 = fstatat(iVar2,pcVar3,&local_a8,0x100);
    if (-1 < iVar1) goto LAB_0031cce8;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
LAB_0031cce8:
    if ((local_a8.st_mode & 0xf000) == 0x4000) {
      do {
        fd_00 = openat(iVar2,pcVar3,0x90000);
        if (-1 < fd_00) goto LAB_0031cd28;
        iVar1 = _::Debug::getOsErrorNumber(false);
      } while (iVar1 == -1);
      if (iVar1 == 0) {
LAB_0031cd28:
        rmrfChildrenAndClose(fd_00);
        do {
          iVar1 = unlinkat(iVar2,pcVar3,0x200);
          if (-1 < iVar1) {
            return true;
          }
          iVar1 = _::Debug::getOsErrorNumber(false);
        } while (iVar1 == -1);
        if (iVar1 == 0) {
          return true;
        }
        pcVar3 = "unlinkat(fd, path.cStr(), AT_REMOVEDIR)";
        iVar2 = 0xd8;
      }
      else {
        pcVar3 = 
        "subdirFd = openat( fd, path.cStr(), O_RDONLY | MAYBE_O_DIRECTORY | MAYBE_O_CLOEXEC)";
        iVar2 = 0xd6;
      }
    }
    else {
      do {
        iVar1 = unlinkat(iVar2,pcVar3,0);
        if (-1 < iVar1) {
          return true;
        }
        iVar1 = _::Debug::getOsErrorNumber(false);
      } while (iVar1 == -1);
      if (iVar1 == 0) {
        return true;
      }
      pcVar3 = "unlinkat(fd, path.cStr(), 0)";
      iVar2 = 0xda;
    }
    _::Debug::Fault::Fault
              (&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,iVar2,iVar1,pcVar3,"");
  }
  else {
    if (iVar1 == 2) {
      return false;
    }
    if (iVar1 == 0x14) {
      return false;
    }
    _::Debug::Fault::Fault<int,kj::StringPtr&>
              (&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0xd0,iVar1,"lstat(path)","path",&local_b8);
  }
  _::Debug::Fault::~Fault(&local_c0);
  return false;
}

Assistant:

static bool rmrf(int fd, StringPtr path) {
  struct stat stats;
  KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd, path.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
    case ENOENT:
    case ENOTDIR:
      // Doesn't exist.
      return false;
    default:
      KJ_FAIL_SYSCALL("lstat(path)", error, path) { return false; }
  }

  if (S_ISDIR(stats.st_mode)) {
    int subdirFd;
    KJ_SYSCALL(subdirFd = openat(
        fd, path.cStr(), O_RDONLY | MAYBE_O_DIRECTORY | MAYBE_O_CLOEXEC)) { return false; }
    rmrfChildrenAndClose(subdirFd);
    KJ_SYSCALL(unlinkat(fd, path.cStr(), AT_REMOVEDIR)) { return false; }
  } else {
    KJ_SYSCALL(unlinkat(fd, path.cStr(), 0)) { return false; }
  }

  return true;
}